

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::ScalarReplacementPass::GetOrCreatePointerType
          (ScalarReplacementPass *this,uint32_t id)

{
  ulong uVar1;
  IRContext *this_00;
  uint32_t uVar2;
  _Hash_node_base *p_Var3;
  mapped_type *pmVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  uint32_t local_1c;
  
  uVar1 = (this->pointee_to_pointer_)._M_h._M_bucket_count;
  uVar5 = (ulong)id % uVar1;
  p_Var6 = (this->pointee_to_pointer_)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var6->_M_nxt, p_Var7 = p_Var6, *(uint32_t *)&p_Var6->_M_nxt[1]._M_nxt != id)) {
    while (p_Var6 = p_Var3, p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, *(uint *)&p_Var3[1]._M_nxt == id)) goto LAB_004fde15;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_004fde15:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var7->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    this_00 = (this->super_MemPass).super_Pass.context_;
    local_1c = id;
    if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(this_00);
    }
    uVar2 = analysis::TypeManager::FindPointerToType
                      ((this_00->type_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                       _M_head_impl,local_1c,Function);
    pmVar4 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->pointee_to_pointer_,&local_1c);
    *pmVar4 = uVar2;
  }
  else {
    uVar2 = *(uint32_t *)((long)&p_Var3[1]._M_nxt + 4);
  }
  return uVar2;
}

Assistant:

uint32_t ScalarReplacementPass::GetOrCreatePointerType(uint32_t id) {
  auto iter = pointee_to_pointer_.find(id);
  if (iter != pointee_to_pointer_.end()) return iter->second;

  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  uint32_t ptr_type_id =
      type_mgr->FindPointerToType(id, spv::StorageClass::Function);
  pointee_to_pointer_[id] = ptr_type_id;
  return ptr_type_id;
}